

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void procFix(void)

{
  procFixStruct *local_10;
  procFixStruct *list;
  
  local_10 = procFixList->next;
  while( true ) {
    if (local_10 == (procFixStruct *)0x0) {
      return;
    }
    if (local_10->proc->val < 0) break;
    fix(local_10->pos,local_10->proc->val - local_10->pos);
    local_10 = local_10->next;
  }
  mark("found lonley prototype");
  exit(-1);
}

Assistant:

procedure 
void procFix(void) {
	variable struct procFixStruct *list;
	list = procFixList->next;
	while (list != NULL) {
		if (list->proc->val < 0) {
			mark("found lonley prototype");
			exit(-1);
		} else {
			fix(list->pos,list->proc->val - list->pos);
		}
		list = list->next;
	}
}